

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O1

Vec_Ptr_t * Gia_GetFakeNames(int nNames)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 in_RAX;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  undefined1 *puVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < nNames - 1U) {
    iVar8 = nNames;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if (0 < nNames) {
    uVar9 = 0;
    do {
      uVar3 = uStack_38;
      if (nNames < 0x1a) {
        uStack_38._0_4_ = CONCAT13((char)uVar9 + 'a',(undefined3)uStack_38);
        puVar6 = (undefined1 *)((long)&uStack_38 + 4);
      }
      else {
        uStack_38._0_4_ =
             CONCAT13((0x60U - ((char)(uVar9 / 0x1a) * '\x19' + (char)(uVar9 / 0x1a)) | 1) +
                      (char)uVar9,(undefined3)uStack_38);
        uStack_38._5_3_ = SUB83(uVar3,5);
        uStack_38._0_5_ = CONCAT14((char)((ulong)uVar9 / 0x1a) + '0',(undefined4)uStack_38);
        puVar6 = (undefined1 *)((long)&uStack_38 + 5);
      }
      *puVar6 = 0;
      pcVar7 = Extra_UtilStrsav((char *)((long)&uStack_38 + 3));
      uVar1 = pVVar4->nSize;
      uVar2 = pVVar4->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar2 * 2;
          if (iVar8 <= (int)uVar2) goto LAB_0070a09d;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = iVar8;
      }
LAB_0070a09d:
      pVVar4->nSize = uVar1 + 1;
      pVVar4->pArray[(int)uVar1] = pcVar7;
      uVar9 = uVar9 + 1;
    } while (nNames != uVar9);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Gia_GetFakeNames( int nNames )
{
    Vec_Ptr_t * vNames;
    char Buffer[5];
    int i;

    vNames = Vec_PtrAlloc( nNames );
    for ( i = 0; i < nNames; i++ )
    {
        if ( nNames < 26 )
        {
            Buffer[0] = 'a' + i;
            Buffer[1] = 0;
        }
        else
        {
            Buffer[0] = 'a' + i%26;
            Buffer[1] = '0' + i/26;
            Buffer[2] = 0;
        }
        Vec_PtrPush( vNames, Extra_UtilStrsav(Buffer) );
    }
    return vNames;
}